

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

string * google::protobuf::compiler::python::
         NamePrefixedWithNestedTypes<google::protobuf::EnumDescriptor>
                   (string *__return_storage_ptr__,EnumDescriptor *descriptor,string_view separator)

{
  ushort *puVar1;
  string_view name_00;
  string_view name_01;
  bool bVar2;
  AlphaNum *in_R8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  string_view separator_00;
  string name;
  string prefix;
  AlphaNum local_118;
  AlphaNum local_e8;
  AlphaNum local_b8;
  AlphaNum local_88;
  AlphaNum local_58;
  
  separator_00._M_len = separator._M_str;
  puVar1 = (ushort *)(descriptor->all_names_).payload_;
  local_118.piece_._M_len = (size_t)*puVar1;
  local_118.piece_._M_str = (char *)((long)puVar1 + ~local_118.piece_._M_len);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&name,&local_118.piece_,(allocator<char> *)&local_e8);
  if (descriptor->containing_type_ == (Descriptor *)0x0) {
    __y_00._M_str = ".";
    __y_00._M_len = 1;
    bVar2 = std::operator==(separator,__y_00);
    if (bVar2) {
      name_00._M_str = name._M_dataplus._M_p;
      name_00._M_len = 0x1a1be7;
      ResolveKeyword_abi_cxx11_(name_00);
      std::__cxx11::string::operator=((string *)&name,(string *)&local_118);
      std::__cxx11::string::~string((string *)&local_118);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p == &name.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(name.field_2._M_allocated_capacity._1_7_,name.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = name.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = name._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(name.field_2._M_allocated_capacity._1_7_,name.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = name._M_string_length;
    name._M_string_length = 0;
    name.field_2._M_local_buf[0] = '\0';
    name._M_dataplus._M_p = (pointer)&name.field_2;
    goto LAB_001a1c40;
  }
  separator_00._M_str = (char *)in_R8;
  NamePrefixedWithNestedTypes<google::protobuf::Descriptor>
            (&prefix,(python *)descriptor->containing_type_,(Descriptor *)separator._M_len,
             separator_00);
  __y._M_str = ".";
  __y._M_len = 1;
  bVar2 = std::operator==(separator,__y);
  if (bVar2) {
    name_01._M_str = (char *)name._M_string_length;
    name_01._M_len = (size_t)name._M_dataplus._M_p;
    bVar2 = IsPythonKeyword(name_01);
    if (!bVar2) goto LAB_001a1b6a;
    local_118.piece_ = absl::lts_20250127::NullSafeStringView("getattr(");
    local_e8.piece_._M_len = prefix._M_string_length;
    local_e8.piece_._M_str = prefix._M_dataplus._M_p;
    local_b8.piece_ = absl::lts_20250127::NullSafeStringView(", \'");
    local_58.piece_._M_len = name._M_string_length;
    local_58.piece_._M_str = name._M_dataplus._M_p;
    local_88.piece_ = absl::lts_20250127::NullSafeStringView("\')");
    absl::lts_20250127::StrCat<>
              (__return_storage_ptr__,&local_118,&local_e8,&local_b8,&local_58,&local_88);
  }
  else {
LAB_001a1b6a:
    local_118.piece_._M_str = prefix._M_dataplus._M_p;
    local_118.piece_._M_len = prefix._M_string_length;
    local_b8.piece_._M_str = name._M_dataplus._M_p;
    local_b8.piece_._M_len = name._M_string_length;
    local_e8.piece_._M_len = separator._M_len;
    local_e8.piece_._M_str = separator_00._M_len;
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_118,&local_e8,&local_b8,in_R8);
  }
  std::__cxx11::string::~string((string *)&prefix);
LAB_001a1c40:
  std::__cxx11::string::~string((string *)&name);
  return __return_storage_ptr__;
}

Assistant:

std::string NamePrefixedWithNestedTypes(const DescriptorT& descriptor,
                                        absl::string_view separator) {
  std::string name = std::string(descriptor.name());
  const Descriptor* parent = descriptor.containing_type();
  if (parent != nullptr) {
    std::string prefix = NamePrefixedWithNestedTypes(*parent, separator);
    if (separator == "." && IsPythonKeyword(name)) {
      return absl::StrCat("getattr(", prefix, ", '", name, "')");
    } else {
      return absl::StrCat(prefix, separator, name);
    }
  }
  if (separator == ".") {
    name = ResolveKeyword(name);
  }
  return name;
}